

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

SampledSpectrum __thiscall
pbrt::GoniometricLight::Phi(GoniometricLight *this,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  Float FVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar15 [56];
  float fVar16;
  SampledSpectrum SVar17;
  undefined1 local_68 [16];
  undefined1 auVar12 [56];
  undefined1 auVar14 [64];
  
  auVar15 = in_ZMM1._8_56_;
  if ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1) {
    local_68 = ZEXT816(0);
  }
  else {
    local_68 = ZEXT816(0);
    lVar4 = 0;
    lVar5 = 0;
    do {
      if (0 < (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x) {
        lVar3 = 0;
        do {
          FVar7 = Image::GetChannel(&this->image,(Point2i)(lVar4 + lVar3),0,(WrapMode2D)0x200000002)
          ;
          in_ZMM1 = ZEXT464((uint)((float)local_68._0_4_ + FVar7));
          local_68._4_4_ = 0;
          local_68._0_4_ = (float)local_68._0_4_ + FVar7;
          local_68._8_8_ = 0;
          lVar3 = lVar3 + 1;
        } while (lVar3 < (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x);
      }
      auVar15 = in_ZMM1._8_56_;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x100000000;
    } while (lVar5 < (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y);
  }
  fVar16 = this->scale;
  auVar8._4_4_ = fVar16;
  auVar8._0_4_ = fVar16;
  auVar8._8_4_ = fVar16;
  auVar8._12_4_ = fVar16;
  auVar12 = ZEXT856(auVar8._8_8_);
  SVar17 = DenselySampledSpectrum::Sample(&this->Iemit,lambda);
  auVar14._0_8_ = SVar17.values.values._8_8_;
  auVar14._8_56_ = auVar15;
  auVar11._0_8_ = SVar17.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  auVar6 = vmovlhps_avx(auVar11._0_16_,auVar14._0_16_);
  auVar9._0_4_ = auVar6._0_4_ * fVar16;
  auVar9._4_4_ = auVar6._4_4_ * fVar16;
  auVar9._8_4_ = auVar6._8_4_ * fVar16;
  auVar9._12_4_ = auVar6._12_4_ * fVar16;
  auVar6._8_4_ = 0x40800000;
  auVar6._0_8_ = 0x4080000040800000;
  auVar6._12_4_ = 0x40800000;
  auVar6 = vmulps_avx512vl(auVar9,auVar6);
  auVar2._8_4_ = 0x40490fdb;
  auVar2._0_8_ = 0x40490fdb40490fdb;
  auVar2._12_4_ = 0x40490fdb;
  auVar6 = vmulps_avx512vl(auVar6,auVar2);
  TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  fVar16 = (float)(TVar1.x * TVar1.y);
  auVar10._0_4_ = (float)local_68._0_4_ * auVar6._0_4_;
  auVar10._4_4_ = (float)local_68._0_4_ * auVar6._4_4_;
  auVar10._8_4_ = (float)local_68._0_4_ * auVar6._8_4_;
  auVar10._12_4_ = (float)local_68._0_4_ * auVar6._12_4_;
  auVar13._4_4_ = fVar16;
  auVar13._0_4_ = fVar16;
  auVar13._8_4_ = fVar16;
  auVar13._12_4_ = fVar16;
  auVar6 = vdivps_avx(auVar10,auVar13);
  auVar2 = vshufpd_avx(auVar6,auVar6,1);
  SVar17.values.values._0_8_ = auVar6._0_8_;
  SVar17.values.values._8_8_ = auVar2._0_8_;
  return (SampledSpectrum)SVar17.values.values;
}

Assistant:

SampledSpectrum GoniometricLight::Phi(const SampledWavelengths &lambda) const {
    Float sumY = 0;
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x)
            sumY += image.GetChannel({x, y}, 0);
    return scale * Iemit.Sample(lambda) * 4 * Pi * sumY /
           (image.Resolution().x * image.Resolution().y);
}